

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall sglr::ReferenceContext::bindVertexArray(ReferenceContext *this,deUint32 array)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  VertexArray *this_00;
  _Base_ptr p_Var4;
  bool bVar5;
  pair<unsigned_int,_sglr::rc::VertexArray_*> local_28;
  
  if (array == 0) {
    this_00 = (VertexArray *)0x0;
    goto LAB_018acdb5;
  }
  p_Var4 = (this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 == (_Base_ptr)0x0) {
LAB_018acd6b:
    this_00 = (VertexArray *)operator_new(0x30);
    rc::VertexArray::VertexArray(this_00,array,(this->m_limits).maxVertexAttribs);
    local_28.first = (this_00->super_NamedObject).m_name;
    if ((this->m_vertexArrays).m_lastName < local_28.first) {
      (this->m_vertexArrays).m_lastName = local_28.first;
    }
    local_28.second = this_00;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::VertexArray*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::VertexArray*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::VertexArray*>>>
    ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::VertexArray*>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::VertexArray*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::VertexArray*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::VertexArray*>>>
                *)&(this->m_vertexArrays).m_objects,&local_28);
  }
  else {
    p_Var2 = &(this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var2->_M_header;
    do {
      bVar5 = p_Var4[1]._M_color < array;
      if (!bVar5) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar5];
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var3 == p_Var2) || (array < p_Var3[1]._M_color)) ||
       (this_00 = (VertexArray *)p_Var3[1]._M_parent, this_00 == (VertexArray *)0x0))
    goto LAB_018acd6b;
  }
  piVar1 = &(this_00->super_NamedObject).m_refCount;
  *piVar1 = *piVar1 + 1;
LAB_018acdb5:
  if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
    rc::ObjectManager<sglr::rc::VertexArray>::releaseReference
              (&this->m_vertexArrays,this->m_vertexArrayBinding);
  }
  this->m_vertexArrayBinding = this_00;
  return;
}

Assistant:

void ReferenceContext::bindVertexArray (deUint32 array)
{
	rc::VertexArray* vertexArrayObject = DE_NULL;

	if (array != 0)
	{
		vertexArrayObject = m_vertexArrays.find(array);
		if (!vertexArrayObject)
		{
			vertexArrayObject = new rc::VertexArray(array, m_limits.maxVertexAttribs);
			m_vertexArrays.insert(vertexArrayObject);
		}
	}

	// Create new references
	if (vertexArrayObject)
		m_vertexArrays.acquireReference(vertexArrayObject);

	// Remove old references
	if (m_vertexArrayBinding)
		m_vertexArrays.releaseReference(m_vertexArrayBinding);

	m_vertexArrayBinding = vertexArrayObject;
}